

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

int __thiscall TiXmlElement::QueryUnsignedAttribute(TiXmlElement *this,char *name,uint *value)

{
  uint in_EAX;
  int iVar1;
  TiXmlAttribute *this_00;
  uint uStack_18;
  int ival;
  
  uStack_18 = in_EAX;
  this_00 = TiXmlAttributeSet::Find(&this->attributeSet,name);
  if (this_00 == (TiXmlAttribute *)0x0) {
    iVar1 = 1;
  }
  else {
    _uStack_18 = (ulong)uStack_18;
    iVar1 = TiXmlAttribute::QueryIntValue(this_00,&ival);
    *value = ival;
  }
  return iVar1;
}

Assistant:

int TiXmlElement::QueryUnsignedAttribute( const char* name, unsigned* value ) const
{
	const TiXmlAttribute* node = attributeSet.Find( name );
	if ( !node )
		return TIXML_NO_ATTRIBUTE;

	int ival = 0;
	int result = node->QueryIntValue( &ival );
	*value = (unsigned)ival;
	return result;
}